

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::lexically_normal(path *__return_storage_ptr__,path *this)

{
  size_t __n;
  int iVar1;
  format fmt;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  path root;
  string_type s;
  iterator __begin2;
  iterator __end2;
  const_iterator local_178;
  long local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  path local_158;
  impl_string_type local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  const_iterator local_f8;
  iterator local_f0;
  iterator local_b0;
  iterator local_70;
  const_iterator cVar2;
  
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  local_178._M_current = (this->_path)._M_dataplus._M_p;
  local_f0._first._M_current = local_178._M_current + (this->_path)._M_string_length;
  local_70._first._M_current = local_178._M_current;
  iterator::iterator(&local_b0,&local_70._first,&local_f0._first,&local_178);
  local_f0._first._M_current = (this->_path)._M_dataplus._M_p;
  local_178._M_current = local_f0._first._M_current + (this->_path)._M_string_length;
  local_118._M_dataplus._M_p = local_178._M_current;
  iterator::iterator(&local_70,&local_f0._first,&local_178,(const_iterator *)&local_118);
  bVar5 = false;
  do {
    if (local_b0._iter._M_current == local_70._iter._M_current) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
        operator_delete(local_70._current._path._M_dataplus._M_p,
                        local_70._current._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._current._path._M_dataplus._M_p != &local_b0._current._path.field_2) {
        operator_delete(local_b0._current._path._M_dataplus._M_p,
                        local_b0._current._path.field_2._M_allocated_capacity + 1);
      }
      if ((__return_storage_ptr__->_path)._M_string_length == 0) {
        assign<char[2]>(__return_storage_ptr__,(char (*) [2])0x18f761);
      }
      return __return_storage_ptr__;
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_b0._current._path._M_dataplus._M_p,
               local_b0._current._path._M_dataplus._M_p + local_b0._current._path._M_string_length);
    iVar1 = std::__cxx11::string::compare((char *)&local_118);
    if (iVar1 == 0) {
      append<char[1]>(__return_storage_ptr__,(char (*) [1])0x19115e);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_118);
      if ((iVar1 == 0) && ((__return_storage_ptr__->_path)._M_string_length != 0)) {
        root_path(&local_158,this);
        __n = (__return_storage_ptr__->_path)._M_string_length;
        if ((__n != local_158._path._M_string_length) ||
           ((__n != 0 &&
            (iVar1 = bcmp((__return_storage_ptr__->_path)._M_dataplus._M_p,
                          local_158._path._M_dataplus._M_p,__n), iVar1 != 0)))) {
          local_178._M_current = (__return_storage_ptr__->_path)._M_dataplus._M_p;
          local_138._M_dataplus._M_p = local_178._M_current + __n;
          local_f8._M_current = local_138._M_dataplus._M_p;
          iterator::iterator(&local_f0,&local_178,(const_iterator *)&local_138,&local_f8);
          local_f0._iter = iterator::decrement(&local_f0,&local_f0._iter);
          iterator::updateCurrent(&local_f0);
          local_178._M_current = (char *)&local_168;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"..","");
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          cVar2._M_current = local_178._M_current;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_138,local_178._M_current,local_178._M_current + local_170);
          fmt = (format)cVar2._M_current;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_current != &local_168) {
            uVar3 = local_168._M_allocated_capacity + 1;
            operator_delete(local_178._M_current,uVar3);
            fmt = (format)uVar3;
          }
          postprocess_path_with_format(&local_138,fmt);
          bVar4 = true;
          if (local_f0._current._path._M_string_length == local_138._M_string_length) {
            if (local_f0._current._path._M_string_length == 0) {
              bVar4 = false;
            }
            else {
              iVar1 = bcmp(local_f0._current._path._M_dataplus._M_p,local_138._M_dataplus._M_p,
                           local_f0._current._path._M_string_length);
              bVar4 = iVar1 != 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._current._path._M_dataplus._M_p != &local_f0._current._path.field_2) {
            operator_delete(local_f0._current._path._M_dataplus._M_p,
                            local_f0._current._path.field_2._M_allocated_capacity + 1);
          }
          if (!bVar4) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._path._M_dataplus._M_p != &local_158._path.field_2) {
              operator_delete(local_158._path._M_dataplus._M_p,
                              local_158._path.field_2._M_allocated_capacity + 1);
            }
            goto LAB_001544b9;
          }
          if ((__return_storage_ptr__->_path)._M_dataplus._M_p
              [(__return_storage_ptr__->_path)._M_string_length - 1] == '/') {
            std::__cxx11::string::pop_back();
          }
          remove_filename(__return_storage_ptr__);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._path._M_dataplus._M_p != &local_158._path.field_2) {
          operator_delete(local_158._path._M_dataplus._M_p,
                          local_158._path.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_001544b9:
        if ((local_118._M_string_length != 0) || (!bVar5)) {
          append<std::__cxx11::string>(__return_storage_ptr__,&local_118);
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_118);
        bVar5 = iVar1 == 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    iterator::operator++(&local_b0);
  } while( true );
}

Assistant:

GHC_INLINE path path::lexically_normal() const
{
    path dest;
    bool lastDotDot = false;
    for (string_type s : *this) {
        if (s == ".") {
            dest /= "";
            continue;
        }
        else if (s == ".." && !dest.empty()) {
            auto root = root_path();
            if (dest == root) {
                continue;
            }
            else if (*(--dest.end()) != "..") {
                if (dest._path.back() == generic_separator) {
                    dest._path.pop_back();
                }
                dest.remove_filename();
                continue;
            }
        }
        if (!(s.empty() && lastDotDot)) {
            dest /= s;
        }
        lastDotDot = s == "..";
    }
    if (dest.empty()) {
        dest = ".";
    }
    return dest;
}